

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<unsigned_char> * __thiscall
asl::Array<unsigned_char>::insert(Array<unsigned_char> *this,int k,uchar *x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  
  puVar4 = this->_a;
  iVar1 = *(int *)(puVar4 + -0x10);
  iVar2 = *(int *)(puVar4 + -0xc);
  iVar6 = k;
  if (k < 0) {
    iVar6 = iVar1;
  }
  if (iVar1 < iVar2) {
    piVar8 = (int *)(puVar4 + -0x10);
LAB_0012a059:
    if (iVar1 - iVar6 != 0 && iVar6 <= iVar1) {
      memmove(this->_a + (long)iVar6 + 1,this->_a + iVar6,(long)(iVar1 - iVar6));
    }
    this->_a[iVar6] = *x;
    *piVar8 = iVar1 + 1;
    return this;
  }
  if (iVar1 != 0x7fffffff) {
    dup(this,k);
    iVar3 = *(int *)(this->_a + -8);
    iVar7 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar7 = iVar2 * 2 + 2;
    }
    piVar8 = (int *)realloc(this->_a + -0x10,(long)iVar7 + 0x10);
    if (piVar8 != (int *)0x0) {
      this->_a = (uchar *)(piVar8 + 4);
      piVar8[1] = iVar7;
      piVar8[2] = iVar3;
      goto LAB_0012a059;
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = dup2;
  __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}